

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O0

Time __thiscall libwebvtt::Time::operator+(Time *this,presentation_t d)

{
  Time TVar1;
  presentation_t d_local;
  Time *this_local;
  Time t;
  
  this_local = *(Time **)this;
  t.hours = this->seconds;
  t.minutes = this->milliseconds;
  operator+=((Time *)&this_local,d);
  TVar1.seconds = t.hours;
  TVar1.milliseconds = t.minutes;
  TVar1._0_8_ = this_local;
  return TVar1;
}

Assistant:

Time Time::operator+(presentation_t d) const {
  Time t(*this);
  t += d;
  return t;
}